

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshtmat.cpp
# Opt level: O1

TPZGenAMatrix<long> * __thiscall
TPZGenAMatrix<long>::operator+=(TPZGenAMatrix<long> *this,TPZGenAMatrix<long> *rval)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  
  if (((this->super_TPZGenMatrix<long>).fRows != (rval->super_TPZGenMatrix<long>).fRows) ||
     ((this->super_TPZGenMatrix<long>).fCols != (rval->super_TPZGenMatrix<long>).fCols)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR-> different TPZGenMatrix<TObj> size for addition",0x36);
  }
  std::ostream::flush();
  lVar3 = (this->super_TPZGenMatrix<long>).fCols * (this->super_TPZGenMatrix<long>).fRows;
  if (0 < lVar3) {
    plVar2 = (this->super_TPZGenMatrix<long>).fMem;
    plVar1 = plVar2 + lVar3;
    plVar4 = (rval->super_TPZGenMatrix<long>).fMem;
    do {
      *plVar2 = *plVar2 + *plVar4;
      plVar2 = plVar2 + 1;
      plVar4 = plVar4 + 1;
    } while (plVar2 < plVar1);
  }
  return this;
}

Assistant:

TPZGenAMatrix<TObj>& TPZGenAMatrix<TObj>::operator+=(const TPZGenAMatrix<TObj> & rval) {
	
	if ( (this->fRows != rval.fRows) || (this->fCols != rval.fCols) )
		cout << "ERROR-> different TPZGenMatrix<TObj> size for addition";
	cout.flush();
	
	TObj *pbeg1 = this->fMem, *pfin;
	TObj *pbeg3 = rval.fMem;
	pfin = pbeg1 + (this->fRows*this->fCols);
	for ( ; pbeg1<pfin; pbeg1++, pbeg3++)
		*pbeg1 += *pbeg3;
	return (*this);
}